

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
read_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
         char *filename,long offset,size_t bytes)

{
  int iVar1;
  size_type __n;
  allocator_type local_231;
  ifstream input;
  
  std::ifstream::ifstream(&input);
  std::ios::exceptions((int)&input + (int)*(undefined8 *)(_input + -0x18));
  std::ifstream::open((char *)&input,(_Ios_Openmode)filename);
  std::istream::seekg((long)&input,_S_beg);
  iVar1 = std::istream::tellg();
  std::istream::seekg((long)&input,(_Ios_Seekdir)offset);
  if (offset < 0) {
    assert::is_true(bytes != 0);
    offset = (long)iVar1 - bytes;
  }
  __n = iVar1 - offset;
  if (bytes != 0) {
    __n = bytes;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_231);
  read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((istream *)&input,__return_storage_ptr__);
  std::ifstream::~ifstream(&input);
  return __return_storage_ptr__;
}

Assistant:

vector<uint8_t> read_file(const char* filename, long offset, size_t bytes)
{
    ifstream input;
    input.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    input.open(filename, ios::in | ios::binary);

    input.seekg(0, ios::end);
    const auto byte_count_file{static_cast<int>(input.tellg())};
    input.seekg(offset, ios::beg);

    if (offset < 0)
    {
        assert::is_true(bytes != 0);
        offset = static_cast<long>(byte_count_file - bytes);
    }
    if (bytes == 0)
    {
        bytes = static_cast<size_t>(byte_count_file) - offset;
    }

    vector<uint8_t> buffer(bytes);
    read(input, buffer);

    return buffer;
}